

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> layer_neuron_num;
  Mat input;
  Mat test_label;
  Mat test_input;
  Mat label;
  Net net;
  vector<int,_std::allocator<int>_> local_4f8;
  vector<int,_std::allocator<int>_> local_4e0;
  string local_4c8;
  string local_4a8;
  string local_488;
  allocator_type local_468 [96];
  Mat local_408 [96];
  Mat local_3a8 [96];
  Mat local_348 [96];
  Mat local_2e8 [96];
  Mat local_288 [96];
  Scalar local_228;
  Net local_200;
  
  local_200.layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x6400000310;
  local_200.layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 10;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_200;
  std::vector<int,_std::allocator<int>_>::vector(&local_4e0,__l,local_468);
  liu::Net::Net(&local_200);
  std::vector<int,_std::allocator<int>_>::vector(&local_4f8,&local_4e0);
  liu::Net::initNet(&local_200,&local_4f8);
  if (local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  liu::Net::initWeights(&local_200,0,0.0,0.01);
  local_228.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.05;
  local_228.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_228.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_228.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  liu::Net::initBias(&local_200,&local_228);
  cv::Mat::Mat((Mat *)local_468);
  cv::Mat::Mat(local_348);
  cv::Mat::Mat(local_3a8);
  cv::Mat::Mat(local_408);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,"data/input_label_1000.xml","");
  liu::get_input_label(&local_488,(Mat *)local_468,local_348,200,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,"data/input_label_1000.xml","");
  liu::get_input_label(&local_4a8,local_3a8,local_408,200,800);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  local_200.output_interval = 2;
  local_200.learning_rate = 0.3;
  std::__cxx11::string::_M_replace
            ((ulong)&local_200.activation_function,0,
             (char *)local_200.activation_function._M_string_length,0x10a02e);
  cv::Mat::Mat(local_288,(Mat *)local_468);
  cv::Mat::Mat(local_2e8,local_348);
  liu::Net::train(&local_200,local_288,local_2e8,0.3,true);
  cv::Mat::~Mat(local_2e8);
  cv::Mat::~Mat(local_288);
  liu::Net::test(&local_200,local_3a8,local_408);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c8,"models/model_sigmoid_800_200_test.xml","");
  liu::Net::save(&local_200,&local_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  getchar();
  cv::Mat::~Mat(local_408);
  cv::Mat::~Mat(local_3a8);
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat((Mat *)local_468);
  liu::Net::~Net(&local_200);
  if (local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	//Set neuron number of every layer
	vector<int> layer_neuron_num = { 784,100,10 };

	// Initialise Net and weights
	Net net;
	net.initNet(layer_neuron_num);
	net.initWeights(0, 0., 0.01);
	net.initBias(Scalar(0.05));

	//Get test samples and test samples 
	Mat input, label,test_input,test_label;
	int sample_number = 200;
	get_input_label("data/input_label_1000.xml",input, label, sample_number);
	get_input_label("data/input_label_1000.xml", test_input, test_label, 200, 800);

	//Set loss threshold,learning rate and activation function
	float loss_threshold = 0.3;
	net.learning_rate = 0.3;
	net.output_interval = 2;
	net.activation_function = "sigmoid";

	//convert label from 0---1 to -1---1,cause tanh function range is [-1,1]
	//label = 2 * label - 1;

	//Train,and draw the loss curve(cause the last parameter is ture) and test the trained net
	net.train(input, label, loss_threshold,true);
	net.test(test_input, test_label);

	//Save the model
	net.save("models/model_sigmoid_800_200_test.xml");

	getchar();
	return 0;

}